

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int sat_solver2_addclause(sat_solver2 *s,lit *begin,lit *end,int Id)

{
  int iVar1;
  lit lVar2;
  int iVar3;
  int v;
  int *begin_00;
  lit *end_00;
  clause *c_00;
  bool bVar4;
  int local_7c;
  clause *c;
  int CidNew;
  int proof_id;
  int k;
  int x;
  lit l;
  int temp;
  int count;
  int maxvar;
  lit *iFree;
  lit *j;
  lit *i;
  cla Cid;
  int Id_local;
  lit *end_local;
  lit *begin_local;
  sat_solver2 *s_local;
  
  _count = (int *)0x0;
  iVar1 = solver2_dlevel(s);
  if (iVar1 != 0) {
    __assert_fail("solver2_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x50c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x50d,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (Id == 0) {
    __assert_fail("Id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x50e,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  veci_resize(&s->temp_clause,0);
  for (j = begin; j < end; j = j + 1) {
    veci_push(&s->temp_clause,*j);
  }
  begin_00 = veci_begin(&s->temp_clause);
  iVar1 = veci_size(&s->temp_clause);
  end_00 = begin_00 + iVar1;
  temp = lit_var(*begin_00);
  j = begin_00;
  while (j = j + 1, j < end_00) {
    lVar2 = *j;
    iVar1 = lit_var(lVar2);
    if (temp < iVar1) {
      local_7c = lit_var(lVar2);
    }
    else {
      local_7c = temp;
    }
    temp = local_7c;
    iFree = j;
    while( true ) {
      bVar4 = false;
      if (begin_00 < iFree) {
        bVar4 = lVar2 < iFree[-1];
      }
      if (!bVar4) break;
      *iFree = iFree[-1];
      iFree = iFree + -1;
    }
    *iFree = lVar2;
  }
  sat_solver2_setnvars(s,temp + 1);
  iFree = begin_00 + 1;
  for (j = iFree; j < end_00; j = j + 1) {
    iVar1 = j[-1];
    lVar2 = lit_neg(*j);
    if (iVar1 == lVar2) {
      iVar1 = clause2_create_new(s,begin_00,end_00,0,0);
      return iVar1;
    }
    if (j[-1] != *j) {
      *iFree = *j;
      iFree = iFree + 1;
    }
  }
  if (begin_00 < iFree) {
    l = 0;
    j = begin_00;
    while( true ) {
      if (iFree <= j) {
        if ((long)iFree - (long)begin_00 >> 2 <= (long)l) {
          __assert_fail("count < end-begin",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x53c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
        }
        iVar1 = *_count;
        *_count = *begin_00;
        *begin_00 = iVar1;
        iVar1 = clause2_create_new(s,begin_00,iFree,0,0);
        if (Id != 0) {
          clause2_set_id(s,iVar1,Id);
        }
        if (((long)(l + 1) == (long)iFree - (long)begin_00 >> 2) && (s->fProofLogging != 0)) {
          if (l == 0) {
            iVar3 = lit_var(*begin_00);
            var_set_unit_clause(s,iVar3,iVar1);
            iVar3 = solver2_enqueue(s,*begin_00,0);
            if (iVar3 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x551,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
            }
          }
          else {
            c_00 = clause2_read(s,iVar1);
            proof_chain_start(s,c_00);
            CidNew = 1;
            while( true ) {
              bVar4 = false;
              if (CidNew < (int)((uint)*c_00 >> 0xb)) {
                proof_id = lit_var((lit)c_00[(long)CidNew + 1]);
                bVar4 = proof_id != 0;
              }
              if (!bVar4) break;
              proof_chain_resolve(s,(clause *)0x0,proof_id);
              CidNew = CidNew + 1;
            }
            iVar3 = proof_chain_stop(s);
            iVar3 = clause2_create_new(s,begin_00,begin_00 + 1,1,iVar3);
            v = lit_var(*begin_00);
            var_set_unit_clause(s,v,iVar3);
            iVar3 = solver2_enqueue(s,*begin_00,iVar1);
            if (iVar3 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x560,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
            }
          }
        }
        return iVar1;
      }
      if (j != begin_00) {
        iVar1 = lit_var(j[-1]);
        iVar3 = lit_var(*j);
        if (iVar1 == iVar3) {
          __assert_fail("i == begin || lit_var(*(i-1)) != lit_var(*i)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x533,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
        }
      }
      iVar1 = lit_var(*j);
      iVar1 = var_value(s,iVar1);
      iVar3 = lit_sign(*j);
      if (iVar1 == iVar3) break;
      iVar1 = lit_var(*j);
      iVar1 = var_value(s,iVar1);
      if (iVar1 == 3) {
        _count = j;
      }
      else {
        l = l + 1;
      }
      j = j + 1;
    }
    iVar1 = clause2_create_new(s,begin_00,iFree,0,0);
    return iVar1;
  }
  __assert_fail("begin < end",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                ,0x52c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
}

Assistant:

int sat_solver2_addclause(sat_solver2* s, lit* begin, lit* end, int Id)
{
    cla Cid;
    lit *i,*j,*iFree = NULL;
    int maxvar, count, temp;
    assert( solver2_dlevel(s) == 0 );
    assert( begin < end );
    assert( Id != 0 );

    // copy clause into storage
    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver2_setnvars(s,maxvar+1);


    // delete duplicates
    for (i = j = begin + 1; i < end; i++)
    {
        if ( *(i-1) == lit_neg(*i) ) // tautology
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( *(i-1) != *i )
            *j++ = *i;
    }
    end = j;
    assert( begin < end );

    // coount the number of 0-literals
    count = 0;
    for ( i = begin; i < end; i++ )
    {
        // make sure all literals are unique
        assert( i == begin || lit_var(*(i-1)) != lit_var(*i) );
        // consider the value of this literal
        if ( var_value(s, lit_var(*i)) == lit_sign(*i) ) // this clause is always true
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( var_value(s, lit_var(*i)) == varX ) // unassigned literal
            iFree = i;
        else
            count++; // literal is 0
    }
    assert( count < end-begin ); // the clause cannot be UNSAT

    // swap variables to make sure the clause is watched using unassigned variable
    temp   = *iFree;
    *iFree = *begin;
    *begin = temp;

    // create a new clause
    Cid = clause2_create_new( s, begin, end, 0, 0 );
    if ( Id )
        clause2_set_id( s, Cid, Id );

    // handle unit clause
    if ( count+1 == end-begin )
    {
        if ( s->fProofLogging )
        {
            if ( count == 0 ) // original learned clause
            {
                var_set_unit_clause( s, lit_var(begin[0]), Cid );
                if ( !solver2_enqueue(s,begin[0],0) )
                    assert( 0 );
            }
            else
            {
                // Log production of top-level unit clause:
                int x, k, proof_id, CidNew;
                clause* c = clause2_read(s, Cid);
                proof_chain_start( s, c );
                clause_foreach_var( c, x, k, 1 )
                    proof_chain_resolve( s, NULL, x );
                proof_id = proof_chain_stop( s );
                // generate a new clause
                CidNew = clause2_create_new( s, begin, begin+1, 1, proof_id );
                var_set_unit_clause( s, lit_var(begin[0]), CidNew );
                if ( !solver2_enqueue(s,begin[0],Cid) )
                    assert( 0 );
            }
        }
    }
    return Cid;
}